

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::addEdge(CFG *this,CfgNode *src,CfgNode *dst,unsigned_long_long count)

{
  uint __line;
  bool bVar1;
  CfgEdge *pCVar2;
  _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
  *p_Var3;
  char *__assertion;
  CfgNode *dst_local;
  CfgNode *src_local;
  CfgEdge *local_30;
  
  dst_local = dst;
  src_local = src;
  if (src != (CfgNode *)0x0) {
    bVar1 = containsNode(this,src);
    if (bVar1) {
      if (dst != (CfgNode *)0x0) {
        bVar1 = containsNode(this,dst);
        if (bVar1) {
          pCVar2 = findEdge(this,src,dst);
          if (pCVar2 == (CfgEdge *)0x0) {
            pCVar2 = (CfgEdge *)operator_new(0x20);
            CfgEdge::CfgEdge(pCVar2,src,dst,count);
            local_30 = pCVar2;
            std::
            _Rb_tree<CfgEdge*,CfgEdge*,std::_Identity<CfgEdge*>,std::less<CfgEdge*>,std::allocator<CfgEdge*>>
            ::_M_insert_unique<CfgEdge*const&>
                      ((_Rb_tree<CfgEdge*,CfgEdge*,std::_Identity<CfgEdge*>,std::less<CfgEdge*>,std::allocator<CfgEdge*>>
                        *)&this->m_edges,&local_30);
            p_Var3 = (_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                      *)std::
                        map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
                        ::operator[](&this->m_succs,&src_local);
            std::
            _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
            ::_M_insert_unique<CfgNode*const&>(p_Var3,&dst_local);
            p_Var3 = (_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                      *)std::
                        map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
                        ::operator[](&this->m_preds,&dst_local);
            std::
            _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
            ::_M_insert_unique<CfgNode*const&>(p_Var3,&src_local);
            this->m_status = UNCHECKED;
          }
          else {
            pCVar2->m_count = pCVar2->m_count + count;
          }
          return;
        }
      }
      __assertion = "dst != 0 && this->containsNode(dst)";
      __line = 0x6c;
      goto LAB_001069fc;
    }
  }
  __assertion = "src != 0 && this->containsNode(src)";
  __line = 0x6b;
LAB_001069fc:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,__line,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
}

Assistant:

void CFG::addEdge(CfgNode* src, CfgNode* dst, unsigned long long count) {
	assert(src != 0 && this->containsNode(src));
	assert(dst != 0 && this->containsNode(dst));

	CfgEdge* edge = this->findEdge(src, dst);
	if (edge)
		// Update edge count if already added.
		edge->updateCount(count);
	else {
		// Create and add edge.
		edge = new CfgEdge(src, dst, count);
		m_edges.insert(edge);

		m_succs[src].insert(dst);
		m_preds[dst].insert(src);

		m_status = CFG::UNCHECKED;
	}
}